

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

errr finish_parse_eff(parser *p)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char **ppcVar7;
  blow_effect *pbVar8;
  void *pvVar9;
  undefined8 *p_00;
  uint16_t uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  z_info->blow_effects_max = 0;
  pvVar9 = parser_priv(p);
  uVar10 = z_info->blow_effects_max;
  if (pvVar9 != (void *)0x0) {
    do {
      uVar10 = uVar10 + 1;
      pvVar9 = *(void **)((long)pvVar9 + 0x30);
    } while (pvVar9 != (void *)0x0);
    z_info->blow_effects_max = uVar10;
  }
  uVar13 = (ulong)uVar10;
  blow_effects = (blow_effect *)mem_zalloc(uVar13 * 0x38 + 0x38);
  p_00 = (undefined8 *)parser_priv(p);
  if (p_00 != (undefined8 *)0x0) {
    lVar12 = uVar13 * 0x38;
    do {
      pbVar8 = blow_effects;
      ppcVar7 = &blow_effects->name;
      *(undefined8 *)((long)blow_effects + lVar12 + -8) = p_00[6];
      uVar2 = *p_00;
      uVar3 = p_00[1];
      uVar4 = p_00[2];
      uVar5 = p_00[3];
      uVar6 = p_00[5];
      puVar1 = (undefined8 *)((long)pbVar8 + lVar12 + -0x18);
      *puVar1 = p_00[4];
      puVar1[1] = uVar6;
      puVar1 = (undefined8 *)((long)pbVar8 + lVar12 + -0x28);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      puVar1 = (undefined8 *)((long)&pbVar8[-1].name + lVar12);
      *puVar1 = uVar2;
      puVar1[1] = uVar3;
      puVar1 = (undefined8 *)p_00[6];
      lVar11 = (long)ppcVar7 + lVar12;
      if ((long)(ulong)z_info->blow_effects_max <= (long)uVar13) {
        lVar11 = 0;
      }
      *(long *)((long)pbVar8 + lVar12 + -8) = lVar11;
      mem_free(p_00);
      lVar12 = lVar12 + -0x38;
      p_00 = puVar1;
      uVar13 = uVar13 - 1;
    } while (puVar1 != (undefined8 *)0x0);
  }
  z_info->blow_effects_max = z_info->blow_effects_max + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_eff(struct parser *p) {
	struct blow_effect *eff, *next = NULL;
	int count;

	/* Count the entries */
	z_info->blow_effects_max = 0;
	eff = parser_priv(p);
	while (eff) {
		z_info->blow_effects_max++;
		eff = eff->next;
	}

	/* Allocate the direct access list and copy the data to it */
	count = z_info->blow_effects_max - 1;
	blow_effects = mem_zalloc((z_info->blow_effects_max + 1) * sizeof(*eff));
	for (eff = parser_priv(p); eff; eff = next, count--) {
		memcpy(&blow_effects[count], eff, sizeof(*eff));
		next = eff->next;
		if (count < z_info->blow_effects_max - 1)
			blow_effects[count].next = &blow_effects[count + 1];
		else
			blow_effects[count].next = NULL;

		mem_free(eff);
	}
	z_info->blow_effects_max++;

	parser_destroy(p);
	return 0;
}